

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector3 Vector3Perpendicular(Vector3 v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vector3 VVar10;
  
  fVar4 = v.z;
  fVar1 = v.x;
  fVar3 = v.y;
  fVar2 = ABS(fVar1);
  fVar8 = ABS(fVar3);
  fVar6 = fVar8;
  if (fVar2 <= fVar8) {
    fVar6 = fVar2;
  }
  fVar7 = 0.0;
  fVar9 = 0.0;
  if (fVar6 <= ABS(fVar4)) {
    fVar7 = (float)(-(uint)(fVar8 < fVar2) & 0x3f800000);
    fVar9 = 1.0;
  }
  fVar5 = (float)(-(uint)(ABS(fVar4) < fVar6) & 0x3f800000);
  fVar6 = 0.0;
  if (fVar2 <= fVar8) {
    fVar6 = fVar9;
  }
  VVar10.x = fVar3 * fVar5 - fVar7 * fVar4;
  VVar10.y = fVar4 * fVar6 - fVar5 * fVar1;
  VVar10.z = fVar1 * fVar7 - fVar6 * fVar3;
  return VVar10;
}

Assistant:

RMAPI Vector3 Vector3Perpendicular(Vector3 v)
{
    Vector3 result = { 0 };

    float min = fabsf(v.x);
    Vector3 cardinalAxis = {1.0f, 0.0f, 0.0f};

    if (fabsf(v.y) < min)
    {
        min = fabsf(v.y);
        Vector3 tmp = {0.0f, 1.0f, 0.0f};
        cardinalAxis = tmp;
    }

    if (fabsf(v.z) < min)
    {
        Vector3 tmp = {0.0f, 0.0f, 1.0f};
        cardinalAxis = tmp;
    }

    // Cross product between vectors
    result.x = v.y*cardinalAxis.z - v.z*cardinalAxis.y;
    result.y = v.z*cardinalAxis.x - v.x*cardinalAxis.z;
    result.z = v.x*cardinalAxis.y - v.y*cardinalAxis.x;

    return result;
}